

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O0

int phr_parse_request(char *buf_start,size_t len,char **method,size_t *method_len,char **path,
                     size_t *path_len,int *minor_version,phr_header *headers,size_t *num_headers,
                     size_t last_len)

{
  char *pcVar1;
  int local_6c;
  size_t sStack_68;
  int r;
  size_t max_headers;
  char *buf_end;
  char *buf;
  size_t *path_len_local;
  char **path_local;
  size_t *method_len_local;
  char **method_local;
  size_t len_local;
  char *buf_start_local;
  
  max_headers = (size_t)(buf_start + len);
  sStack_68 = *num_headers;
  *method = (char *)0x0;
  *method_len = 0;
  *path = (char *)0x0;
  *path_len = 0;
  *minor_version = -1;
  *num_headers = 0;
  buf_end = buf_start;
  buf = (char *)path_len;
  path_len_local = (size_t *)path;
  path_local = (char **)method_len;
  method_len_local = (size_t *)method;
  method_local = (char **)len;
  len_local = (size_t)buf_start;
  if ((last_len != 0) &&
     (pcVar1 = is_complete(buf_start,(char *)max_headers,last_len,&local_6c), pcVar1 == (char *)0x0)
     ) {
    return local_6c;
  }
  pcVar1 = parse_request(buf_end,(char *)max_headers,(char **)method_len_local,(size_t *)path_local,
                         (char **)path_len_local,(size_t *)buf,minor_version,headers,num_headers,
                         sStack_68,&local_6c);
  if (pcVar1 == (char *)0x0) {
    buf_start_local._4_4_ = local_6c;
  }
  else {
    buf_start_local._4_4_ = (int)pcVar1 - (int)len_local;
  }
  return buf_start_local._4_4_;
}

Assistant:

int phr_parse_request(const char *buf_start, size_t len, const char **method,
					  size_t *method_len, const char **path, size_t *path_len,
					  int *minor_version, struct phr_header *headers,
					  size_t *num_headers, size_t last_len)
{
	const char *buf = buf_start, *buf_end = buf_start + len;
	size_t max_headers = *num_headers;
	int r;

	*method = NULL;
	*method_len = 0;
	*path = NULL;
	*path_len = 0;
	*minor_version = -1;
	*num_headers = 0;

	/* if last_len != 0, check if the request is complete (a fast countermeasure
	   againt slowloris */
	if (last_len != 0 && is_complete(buf, buf_end, last_len, &r) == NULL) {
		return r;
	}

	if ((buf = parse_request(buf, buf_end, method, method_len, path, path_len,
							 minor_version, headers, num_headers, max_headers,
							 &r)) == NULL) {
		return r;
	}

	return (int)(buf - buf_start);
}